

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_Parse(char *value)

{
  cJSON *item;
  char *pcVar1;
  
  item = (cJSON *)(*cJSON_malloc)(0x40);
  if (item == (cJSON *)0x0) {
    ep = (char *)0x0;
  }
  else {
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    ep = (char *)0x0;
    if (value != (char *)0x0) {
      value = value + -1;
      do {
        pcVar1 = value + 1;
        value = value + 1;
      } while ((byte)(*pcVar1 - 1U) < 0x20);
    }
    pcVar1 = parse_value(item,value);
    if (pcVar1 != (char *)0x0) {
      return item;
    }
    cJSON_Delete(item);
  }
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_Parse(const char *value)
{
	cJSON *c=cJSON_New_Item();
	ep=0;
	if (!c) return 0;       /* memory fail */

	if (!parse_value(c,skip(value))) {cJSON_Delete(c);return 0;}
	return c;
}